

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::CertErrorParams2Der::CertErrorParams2Der
          (CertErrorParams2Der *this,char *name1,Input der1,char *name2,Input der2)

{
  allocator<char> local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_len = der1.data_.size_;
  local_30._M_str = (char *)der1.data_.data_;
  (this->super_CertErrorParams)._vptr_CertErrorParams =
       (_func_int **)&PTR__CertErrorParams2Der_005c0738;
  this->name1_ = name1;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->der1_,&local_30,&local_31);
  this->name2_ = name2;
  local_30._M_len = der2.data_.size_;
  local_30._M_str = (char *)der2.data_.data_;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->der2_,&local_30,&local_31);
  return;
}

Assistant:

CertErrorParams2Der(const char *name1, der::Input der1, const char *name2,
                      der::Input der2)
      : name1_(name1),
        der1_(BytesAsStringView(der1)),
        name2_(name2),
        der2_(BytesAsStringView(der2)) {}